

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  size_type sVar17;
  size_t sVar18;
  size_type sVar19;
  bool bVar20;
  undefined7 uVar21;
  
  uVar2 = *(undefined4 *)&(param_1->assertionResult).m_info.field_0x34;
  (this->assertionResult).m_info.resultDisposition =
       (param_1->assertionResult).m_info.resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar2;
  uVar2 = *(undefined4 *)&(param_1->assertionResult).m_info.macroName.m_start;
  uVar3 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.macroName.m_start + 4);
  sVar17 = (param_1->assertionResult).m_info.macroName.m_size;
  uVar4 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.macroName.m_size + 4);
  uVar5 = *(undefined4 *)&(param_1->assertionResult).m_info.lineInfo.file;
  uVar6 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.lineInfo.file + 4);
  sVar18 = (param_1->assertionResult).m_info.lineInfo.line;
  uVar7 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.lineInfo.line + 4);
  uVar8 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.capturedExpression.m_start + 4);
  sVar19 = (param_1->assertionResult).m_info.capturedExpression.m_size;
  uVar9 = *(undefined4 *)((long)&(param_1->assertionResult).m_info.capturedExpression.m_size + 4);
  *(undefined4 *)&(this->assertionResult).m_info.capturedExpression.m_start =
       *(undefined4 *)&(param_1->assertionResult).m_info.capturedExpression.m_start;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_start + 4) = uVar8;
  *(int *)&(this->assertionResult).m_info.capturedExpression.m_size = (int)sVar19;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_size + 4) = uVar9;
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file = uVar5;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar6;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar18;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar7;
  *(undefined4 *)&(this->assertionResult).m_info.macroName.m_start = uVar2;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_start + 4) = uVar3;
  *(int *)&(this->assertionResult).m_info.macroName.m_size = (int)sVar17;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_size + 4) = uVar4;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar1 = (param_1->assertionResult).m_resultData.message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData,pcVar1,
             pcVar1 + (param_1->assertionResult).m_resultData.message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar1 = (param_1->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar1,
             pcVar1 + (param_1->assertionResult).m_resultData.reconstructedExpression.
                      _M_string_length);
  (this->assertionResult).m_resultData.resultType =
       (param_1->assertionResult).m_resultData.resultType;
  bVar20 = (param_1->assertionResult).m_resultData.lazyExpression.m_isNegated;
  uVar21 = *(undefined7 *)&(param_1->assertionResult).m_resultData.lazyExpression.field_0x9;
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (param_1->assertionResult).m_resultData.lazyExpression.m_transientExpression;
  (this->assertionResult).m_resultData.lazyExpression.m_isNegated = bVar20;
  *(undefined7 *)&(this->assertionResult).m_resultData.lazyExpression.field_0x9 = uVar21;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  uVar10 = (param_1->totals).assertions.passed;
  uVar11 = (param_1->totals).assertions.failed;
  uVar12 = (param_1->totals).assertions.failedButOk;
  uVar13 = (param_1->totals).assertions.skipped;
  uVar14 = (param_1->totals).testCases.passed;
  uVar15 = (param_1->totals).testCases.failed;
  uVar16 = (param_1->totals).testCases.skipped;
  (this->totals).testCases.failedButOk = (param_1->totals).testCases.failedButOk;
  (this->totals).testCases.skipped = uVar16;
  (this->totals).testCases.passed = uVar14;
  (this->totals).testCases.failed = uVar15;
  (this->totals).assertions.failedButOk = uVar12;
  (this->totals).assertions.skipped = uVar13;
  (this->totals).assertions.passed = uVar10;
  (this->totals).assertions.failed = uVar11;
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;